

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O3

CURLcode Curl_output_aws_sigv4(Curl_easy *data,_Bool proxy)

{
  curl_slist **ppcVar1;
  undefined1 *puVar2;
  byte bVar3;
  connectdata *conn;
  curl_trc_feat *pcVar4;
  byte *pbVar5;
  bool bVar6;
  curl_slist *pcVar7;
  char cVar8;
  int iVar9;
  CURLcode CVar10;
  int iVar11;
  char *pcVar12;
  size_t sVar13;
  time_t intime;
  size_t sVar14;
  char *pcVar15;
  curl_slist *pcVar16;
  long lVar17;
  char *pcVar18;
  byte *pbVar19;
  byte *pbVar20;
  curl_slist *list;
  curl_slist *pcVar21;
  char *pcVar22;
  char *pcVar23;
  uchar *input;
  uchar *data_00;
  uchar *key_00;
  byte *pbVar24;
  curl_slist *pcVar25;
  ulong uVar26;
  curl_slist *pcVar27;
  char *pcVar28;
  size_t sVar29;
  char *tmp;
  bool bVar30;
  bool bVar31;
  uchar *local_4a0;
  char *local_488;
  char *local_480;
  Curl_HttpReq httpreq;
  char timestamp [17];
  char *method;
  uchar sign0 [32];
  char service [65];
  uchar sign1 [32];
  dynbuf signed_headers;
  char region [65];
  char provider0 [65];
  char provider1 [65];
  dynbuf canonical_query;
  dynbuf canonical_headers;
  uchar sha_hash [32];
  dynbuf canonical_path;
  char sha_hex [65];
  char key [82];
  char content_sha256_hdr [151];
  char date_hdr_key [72];
  tm tm;
  
  conn = data->conn;
  provider0[0x40] = '\0';
  provider0[0x30] = '\0';
  provider0[0x31] = '\0';
  provider0[0x32] = '\0';
  provider0[0x33] = '\0';
  provider0[0x34] = '\0';
  provider0[0x35] = '\0';
  provider0[0x36] = '\0';
  provider0[0x37] = '\0';
  provider0[0x38] = '\0';
  provider0[0x39] = '\0';
  provider0[0x3a] = '\0';
  provider0[0x3b] = '\0';
  provider0[0x3c] = '\0';
  provider0[0x3d] = '\0';
  provider0[0x3e] = '\0';
  provider0[0x3f] = '\0';
  provider0[0x20] = '\0';
  provider0[0x21] = '\0';
  provider0[0x22] = '\0';
  provider0[0x23] = '\0';
  provider0[0x24] = '\0';
  provider0[0x25] = '\0';
  provider0[0x26] = '\0';
  provider0[0x27] = '\0';
  provider0[0x28] = '\0';
  provider0[0x29] = '\0';
  provider0[0x2a] = '\0';
  provider0[0x2b] = '\0';
  provider0[0x2c] = '\0';
  provider0[0x2d] = '\0';
  provider0[0x2e] = '\0';
  provider0[0x2f] = '\0';
  provider0[0x10] = '\0';
  provider0[0x11] = '\0';
  provider0[0x12] = '\0';
  provider0[0x13] = '\0';
  provider0[0x14] = '\0';
  provider0[0x15] = '\0';
  provider0[0x16] = '\0';
  provider0[0x17] = '\0';
  provider0[0x18] = '\0';
  provider0[0x19] = '\0';
  provider0[0x1a] = '\0';
  provider0[0x1b] = '\0';
  provider0[0x1c] = '\0';
  provider0[0x1d] = '\0';
  provider0[0x1e] = '\0';
  provider0[0x1f] = '\0';
  provider0[0] = '\0';
  provider0[1] = '\0';
  provider0[2] = '\0';
  provider0[3] = '\0';
  provider0[4] = '\0';
  provider0[5] = '\0';
  provider0[6] = '\0';
  provider0[7] = '\0';
  provider0[8] = '\0';
  provider0[9] = '\0';
  provider0[10] = '\0';
  provider0[0xb] = '\0';
  provider0[0xc] = '\0';
  provider0[0xd] = '\0';
  provider0[0xe] = '\0';
  provider0[0xf] = '\0';
  provider1[0x40] = '\0';
  provider1[0x30] = '\0';
  provider1[0x31] = '\0';
  provider1[0x32] = '\0';
  provider1[0x33] = '\0';
  provider1[0x34] = '\0';
  provider1[0x35] = '\0';
  provider1[0x36] = '\0';
  provider1[0x37] = '\0';
  provider1[0x38] = '\0';
  provider1[0x39] = '\0';
  provider1[0x3a] = '\0';
  provider1[0x3b] = '\0';
  provider1[0x3c] = '\0';
  provider1[0x3d] = '\0';
  provider1[0x3e] = '\0';
  provider1[0x3f] = '\0';
  provider1[0x20] = '\0';
  provider1[0x21] = '\0';
  provider1[0x22] = '\0';
  provider1[0x23] = '\0';
  provider1[0x24] = '\0';
  provider1[0x25] = '\0';
  provider1[0x26] = '\0';
  provider1[0x27] = '\0';
  provider1[0x28] = '\0';
  provider1[0x29] = '\0';
  provider1[0x2a] = '\0';
  provider1[0x2b] = '\0';
  provider1[0x2c] = '\0';
  provider1[0x2d] = '\0';
  provider1[0x2e] = '\0';
  provider1[0x2f] = '\0';
  provider1[0x10] = '\0';
  provider1[0x11] = '\0';
  provider1[0x12] = '\0';
  provider1[0x13] = '\0';
  provider1[0x14] = '\0';
  provider1[0x15] = '\0';
  provider1[0x16] = '\0';
  provider1[0x17] = '\0';
  provider1[0x18] = '\0';
  provider1[0x19] = '\0';
  provider1[0x1a] = '\0';
  provider1[0x1b] = '\0';
  provider1[0x1c] = '\0';
  provider1[0x1d] = '\0';
  provider1[0x1e] = '\0';
  provider1[0x1f] = '\0';
  provider1[0] = '\0';
  provider1[1] = '\0';
  provider1[2] = '\0';
  provider1[3] = '\0';
  provider1[4] = '\0';
  provider1[5] = '\0';
  provider1[6] = '\0';
  provider1[7] = '\0';
  provider1[8] = '\0';
  provider1[9] = '\0';
  provider1[10] = '\0';
  provider1[0xb] = '\0';
  provider1[0xc] = '\0';
  provider1[0xd] = '\0';
  provider1[0xe] = '\0';
  provider1[0xf] = '\0';
  region[0x40] = '\0';
  region[0x30] = '\0';
  region[0x31] = '\0';
  region[0x32] = '\0';
  region[0x33] = '\0';
  region[0x34] = '\0';
  region[0x35] = '\0';
  region[0x36] = '\0';
  region[0x37] = '\0';
  region[0x38] = '\0';
  region[0x39] = '\0';
  region[0x3a] = '\0';
  region[0x3b] = '\0';
  region[0x3c] = '\0';
  region[0x3d] = '\0';
  region[0x3e] = '\0';
  region[0x3f] = '\0';
  region[0x20] = '\0';
  region[0x21] = '\0';
  region[0x22] = '\0';
  region[0x23] = '\0';
  region[0x24] = '\0';
  region[0x25] = '\0';
  region[0x26] = '\0';
  region[0x27] = '\0';
  region[0x28] = '\0';
  region[0x29] = '\0';
  region[0x2a] = '\0';
  region[0x2b] = '\0';
  region[0x2c] = '\0';
  region[0x2d] = '\0';
  region[0x2e] = '\0';
  region[0x2f] = '\0';
  region[0x10] = '\0';
  region[0x11] = '\0';
  region[0x12] = '\0';
  region[0x13] = '\0';
  region[0x14] = '\0';
  region[0x15] = '\0';
  region[0x16] = '\0';
  region[0x17] = '\0';
  region[0x18] = '\0';
  region[0x19] = '\0';
  region[0x1a] = '\0';
  region[0x1b] = '\0';
  region[0x1c] = '\0';
  region[0x1d] = '\0';
  region[0x1e] = '\0';
  region[0x1f] = '\0';
  region[0] = '\0';
  region[1] = '\0';
  region[2] = '\0';
  region[3] = '\0';
  region[4] = '\0';
  region[5] = '\0';
  region[6] = '\0';
  region[7] = '\0';
  region[8] = '\0';
  region[9] = '\0';
  region[10] = '\0';
  region[0xb] = '\0';
  region[0xc] = '\0';
  region[0xd] = '\0';
  region[0xe] = '\0';
  region[0xf] = '\0';
  service[0x40] = '\0';
  service[0x30] = '\0';
  service[0x31] = '\0';
  service[0x32] = '\0';
  service[0x33] = '\0';
  service[0x34] = '\0';
  service[0x35] = '\0';
  service[0x36] = '\0';
  service[0x37] = '\0';
  service[0x38] = '\0';
  service[0x39] = '\0';
  service[0x3a] = '\0';
  service[0x3b] = '\0';
  service[0x3c] = '\0';
  service[0x3d] = '\0';
  service[0x3e] = '\0';
  service[0x3f] = '\0';
  service[0x20] = '\0';
  service[0x21] = '\0';
  service[0x22] = '\0';
  service[0x23] = '\0';
  service[0x24] = '\0';
  service[0x25] = '\0';
  service[0x26] = '\0';
  service[0x27] = '\0';
  service[0x28] = '\0';
  service[0x29] = '\0';
  service[0x2a] = '\0';
  service[0x2b] = '\0';
  service[0x2c] = '\0';
  service[0x2d] = '\0';
  service[0x2e] = '\0';
  service[0x2f] = '\0';
  service[0x10] = '\0';
  service[0x11] = '\0';
  service[0x12] = '\0';
  service[0x13] = '\0';
  service[0x14] = '\0';
  service[0x15] = '\0';
  service[0x16] = '\0';
  service[0x17] = '\0';
  service[0x18] = '\0';
  service[0x19] = '\0';
  service[0x1a] = '\0';
  service[0x1b] = '\0';
  service[0x1c] = '\0';
  service[0x1d] = '\0';
  service[0x1e] = '\0';
  service[0x1f] = '\0';
  service[0] = '\0';
  service[1] = '\0';
  service[2] = '\0';
  service[3] = '\0';
  service[4] = '\0';
  service[5] = '\0';
  service[6] = '\0';
  service[7] = '\0';
  service[8] = '\0';
  service[9] = '\0';
  service[10] = '\0';
  service[0xb] = '\0';
  service[0xc] = '\0';
  service[0xd] = '\0';
  service[0xe] = '\0';
  service[0xf] = '\0';
  pcVar18 = (conn->host).name;
  method = (char *)0x0;
  memset(content_sha256_hdr,0,0x97);
  pcVar28 = (data->state).aptr.user;
  if (pcVar28 == (char *)0x0) {
    pcVar28 = "";
  }
  sign0[0x10] = '\0';
  sign0[0x11] = '\0';
  sign0[0x12] = '\0';
  sign0[0x13] = '\0';
  sign0[0x14] = '\0';
  sign0[0x15] = '\0';
  sign0[0x16] = '\0';
  sign0[0x17] = '\0';
  sign0[0x18] = '\0';
  sign0[0x19] = '\0';
  sign0[0x1a] = '\0';
  sign0[0x1b] = '\0';
  sign0[0x1c] = '\0';
  sign0[0x1d] = '\0';
  sign0[0x1e] = '\0';
  sign0[0x1f] = '\0';
  sign0[0] = '\0';
  sign0[1] = '\0';
  sign0[2] = '\0';
  sign0[3] = '\0';
  sign0[4] = '\0';
  sign0[5] = '\0';
  sign0[6] = '\0';
  sign0[7] = '\0';
  sign0[8] = '\0';
  sign0[9] = '\0';
  sign0[10] = '\0';
  sign0[0xb] = '\0';
  sign0[0xc] = '\0';
  sign0[0xd] = '\0';
  sign0[0xe] = '\0';
  sign0[0xf] = '\0';
  sign1[0x10] = '\0';
  sign1[0x11] = '\0';
  sign1[0x12] = '\0';
  sign1[0x13] = '\0';
  sign1[0x14] = '\0';
  sign1[0x15] = '\0';
  sign1[0x16] = '\0';
  sign1[0x17] = '\0';
  sign1[0x18] = '\0';
  sign1[0x19] = '\0';
  sign1[0x1a] = '\0';
  sign1[0x1b] = '\0';
  sign1[0x1c] = '\0';
  sign1[0x1d] = '\0';
  sign1[0x1e] = '\0';
  sign1[0x1f] = '\0';
  sign1[0] = '\0';
  sign1[1] = '\0';
  sign1[2] = '\0';
  sign1[3] = '\0';
  sign1[4] = '\0';
  sign1[5] = '\0';
  sign1[6] = '\0';
  sign1[7] = '\0';
  sign1[8] = '\0';
  sign1[9] = '\0';
  sign1[10] = '\0';
  sign1[0xb] = '\0';
  sign1[0xc] = '\0';
  sign1[0xd] = '\0';
  sign1[0xe] = '\0';
  sign1[0xf] = '\0';
  pcVar12 = Curl_checkheaders(data,"Authorization",0xd);
  if (pcVar12 != (char *)0x0) {
    return CURLE_OK;
  }
  local_480 = "";
  Curl_dyn_init(&canonical_headers,0x19000);
  Curl_dyn_init(&canonical_query,0x19000);
  Curl_dyn_init(&signed_headers,0x19000);
  Curl_dyn_init(&canonical_path,0x19000);
  pcVar12 = (data->set).str[0x44];
  pcVar15 = "aws:amz";
  if (pcVar12 != (char *)0x0) {
    pcVar15 = pcVar12;
  }
  __isoc99_sscanf(pcVar15,"%64[^:]:%64[^:]:%64[^:]:%64s",provider0,provider1,region,service);
  if (provider0[0] == '\0') {
    local_488 = (char *)0x0;
    Curl_failf(data,"first aws-sigv4 provider cannot be empty");
    CVar10 = CURLE_BAD_FUNCTION_ARGUMENT;
LAB_001384bc:
    local_4a0 = (uchar *)0x0;
    input = (uchar *)0x0;
    pcVar18 = (char *)0x0;
  }
  else {
    if (provider1[0] == '\0') {
      strcpy(provider1,provider0);
    }
    if (service[0] != '\0') goto LAB_00137ade;
    pcVar12 = strchr(pcVar18,0x2e);
    if (pcVar12 == (char *)0x0) {
      pcVar18 = "aws-sigv4: service missing in parameters and hostname";
LAB_00137c7e:
      local_488 = (char *)0x0;
      Curl_failf(data,pcVar18);
      CVar10 = CURLE_URL_MALFORMAT;
      goto LAB_001384bc;
    }
    uVar26 = (long)pcVar12 - (long)pcVar18;
    if (0x40 < uVar26) {
      pcVar18 = "aws-sigv4: service too long in hostname";
      goto LAB_00137c7e;
    }
    memcpy(service,pcVar18,uVar26);
    service[uVar26] = '\0';
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)))) {
      Curl_infof(data,"aws_sigv4: picked service %s from host",service);
    }
    if (region[0] == '\0') {
      pcVar12 = pcVar12 + 1;
      pcVar15 = strchr(pcVar12,0x2e);
      if (pcVar15 == (char *)0x0) {
        pcVar18 = "aws-sigv4: region missing in parameters and hostname";
      }
      else {
        uVar26 = (long)pcVar15 - (long)pcVar12;
        if (uVar26 < 0x41) {
          memcpy(region,pcVar12,uVar26);
          region[uVar26] = '\0';
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            Curl_infof(data,"aws_sigv4: picked region %s from host",region);
          }
          goto LAB_00137ade;
        }
        pcVar18 = "aws-sigv4: region too long in hostname";
      }
      goto LAB_00137c7e;
    }
LAB_00137ade:
    Curl_http_method(data,conn,&method,&httpreq);
    iVar9 = curl_strequal(provider0,"aws");
    if (iVar9 == 0) {
      bVar30 = false;
    }
    else {
      iVar9 = curl_strequal(service,"s3");
      bVar30 = iVar9 != 0;
    }
    iVar9 = curl_msnprintf(key,0x52,"x-%s-content-sha256",provider1);
    pcVar12 = Curl_checkheaders(data,key,(long)iVar9);
    if ((pcVar12 == (char *)0x0) || (pcVar12 = strchr(pcVar12,0x3a), pcVar12 == (char *)0x0)) {
      if (bVar30) {
        bVar30 = true;
        if ((httpreq != HTTPREQ_GET) && (httpreq != HTTPREQ_HEAD)) {
          bVar30 = (data->set).filesize == 0;
        }
        if (httpreq == HTTPREQ_POST) {
          bVar31 = (data->set).postfields != (void *)0x0;
        }
        else {
          bVar31 = false;
        }
        if ((bool)(bVar30 | bVar31)) {
          CVar10 = calc_payload_hash(data,sha_hash,sha_hex);
          if (CVar10 != CURLE_OK) goto LAB_00137edb;
        }
        else {
          builtin_strncpy(sha_hex,"UNSIGNED-PAYLOAD",0x11);
        }
        curl_msnprintf(content_sha256_hdr,0x95,"x-%s-content-sha256: %s",provider1,sha_hex);
LAB_00137d9d:
        pcVar12 = sha_hex;
        sVar13 = strlen(pcVar12);
        goto LAB_00137db0;
      }
      CVar10 = calc_payload_hash(data,sha_hash,sha_hex);
      if (CVar10 == CURLE_OK) goto LAB_00137d9d;
LAB_00137edb:
      local_488 = (char *)0x0;
      goto LAB_001384bc;
    }
    do {
      do {
        pcVar15 = pcVar12;
        pcVar12 = pcVar15 + 1;
      } while (*pcVar12 == ' ');
    } while (*pcVar12 == '\t');
    for (sVar13 = strlen(pcVar12); sVar13 != 0; sVar13 = sVar13 - 1) {
      cVar8 = pcVar15[sVar13];
      if ((cVar8 != ' ') && (cVar8 != '\t')) goto LAB_00137db0;
    }
    sVar13 = 0;
LAB_00137db0:
    intime = time((time_t *)0x0);
    CVar10 = Curl_gmtime(intime,&tm);
    if (CVar10 != CURLE_OK) {
      local_488 = (char *)0x0;
      goto LAB_001384bc;
    }
    sVar14 = strftime(timestamp,0x11,"%Y%m%dT%H%M%SZ",(tm *)&tm);
    CVar10 = CURLE_OUT_OF_MEMORY;
    if (sVar14 == 0) goto LAB_00137edb;
    sVar14 = strlen(provider1);
    Curl_strntolower(provider1,provider1,sVar14);
    cVar8 = Curl_raw_toupper(provider1[0]);
    provider1[0] = cVar8;
    list = (curl_slist *)0x0;
    curl_msnprintf(date_hdr_key,0x48,"X-%s-Date",provider1);
    Curl_strntolower(provider1,provider1,1);
    curl_msnprintf(key,0x5a,"x-%s-date:%s",provider1,timestamp);
    pcVar15 = Curl_checkheaders(data,"Host",4);
    if (pcVar15 == (char *)0x0) {
      pcVar15 = (data->state).aptr.host;
      if (pcVar15 == (char *)0x0) {
        pcVar18 = curl_maprintf("host:%s",pcVar18);
      }
      else {
        sVar14 = strcspn(pcVar15,"\n\r");
        pcVar18 = (char *)Curl_memdup0(pcVar15,sVar14);
      }
      if ((pcVar18 != (char *)0x0) &&
         (list = Curl_slist_append_nodup((curl_slist *)0x0,pcVar18), list != (curl_slist *)0x0))
      goto LAB_00137eb4;
      (*Curl_cfree)(pcVar18);
      local_488 = (char *)0x0;
      list = (curl_slist *)0x0;
LAB_001384a0:
      CVar10 = CURLE_OUT_OF_MEMORY;
      curl_slist_free_all(list);
      goto LAB_001384bc;
    }
LAB_00137eb4:
    pcVar16 = list;
    if ((content_sha256_hdr[0] != '\0') &&
       (pcVar16 = curl_slist_append(list,content_sha256_hdr), pcVar16 == (curl_slist *)0x0)) {
LAB_00138204:
      local_488 = (char *)0x0;
      goto LAB_001384a0;
    }
    list = pcVar16;
    for (pcVar27 = (data->set).headers; pcVar16 = list, pcVar27 != (curl_slist *)0x0;
        pcVar27 = pcVar27->next) {
      pcVar18 = pcVar27->data;
      pcVar15 = strchr(pcVar18,0x3a);
      if (((pcVar15 != (char *)0x0) || (pcVar15 = strchr(pcVar18,0x3b), pcVar15 != (char *)0x0)) &&
         ((*pcVar15 != ':' || (pcVar15[1] != '\0')))) {
        lVar17 = 0;
        while (((cVar8 = pcVar15[lVar17 + 1], cVar8 == '\t' || (cVar8 == ' ')) ||
               ((byte)(cVar8 - 10U) < 4))) {
          lVar17 = lVar17 + 1;
        }
        if ((lVar17 == 0) || (cVar8 != '\0')) {
          pcVar18 = (*Curl_cstrdup)(pcVar18);
          if (pcVar18 == (char *)0x0) goto LAB_00138204;
          pcVar18[(long)pcVar15 - (long)pcVar27->data] = ':';
          pcVar16 = Curl_slist_append_nodup(list,pcVar18);
          if (pcVar16 == (curl_slist *)0x0) {
            (*Curl_cfree)(pcVar18);
            local_488 = (char *)0x0;
            goto LAB_001384a0;
          }
        }
      }
      list = pcVar16;
    }
    for (; pcVar16 != (curl_slist *)0x0; pcVar16 = pcVar16->next) {
      pcVar18 = pcVar16->data;
      sVar14 = strcspn(pcVar18,":");
      Curl_strntolower(pcVar18,pcVar18,sVar14);
      if (pcVar16->data[sVar14] != '\0') {
        pcVar18 = pcVar16->data + sVar14 + 1;
        for (pcVar15 = pcVar18; (cVar8 = *pcVar15, cVar8 == '\t' || (cVar8 == ' '));
            pcVar15 = pcVar15 + 1) {
        }
        while (cVar8 != '\0') {
          iVar9 = 0;
          pcVar22 = pcVar15;
          while ((pcVar15 = pcVar22 + 1, cVar8 == ' ' || (cVar8 == '\t'))) {
            iVar9 = iVar9 + -1;
            pcVar22 = pcVar15;
            cVar8 = *pcVar15;
          }
          if (iVar9 != 0) {
            if (cVar8 == '\0') break;
            cVar8 = ' ';
            pcVar15 = pcVar22;
          }
          *pcVar18 = cVar8;
          pcVar18 = pcVar18 + 1;
          cVar8 = *pcVar15;
        }
        *pcVar18 = '\0';
      }
    }
    sVar14 = strlen(date_hdr_key);
    pcVar18 = Curl_checkheaders(data,date_hdr_key,sVar14);
    if ((pcVar18 == (char *)0x0) &&
       (pcVar18 = Curl_checkheaders(data,"Date",4), pcVar18 == (char *)0x0)) {
      pcVar16 = curl_slist_append(list,key);
      if (pcVar16 == (curl_slist *)0x0) {
        local_488 = (char *)0x0;
        goto LAB_001384a0;
      }
      local_488 = curl_maprintf("%s: %s\r\n",date_hdr_key,timestamp);
      list = pcVar16;
LAB_00138269:
      pcVar16 = list->next;
      pcVar27 = list;
      if (pcVar16 != (curl_slist *)0x0) {
        do {
          pcVar7 = pcVar16;
          pcVar25 = list;
          bVar30 = false;
          do {
            while( true ) {
              pcVar21 = pcVar7;
              pcVar18 = pcVar25->data;
              pcVar15 = pcVar21->data;
              pcVar22 = strchr(pcVar18,0x3a);
              pcVar23 = strchr(pcVar15,0x3a);
              if (pcVar22 == (char *)0x0) {
                sVar14 = strlen(pcVar18);
              }
              else {
                sVar14 = (long)pcVar22 - (long)pcVar18;
              }
              if (pcVar23 == (char *)0x0) {
                sVar29 = strlen(pcVar15);
              }
              else {
                sVar29 = (long)pcVar23 - (long)pcVar15;
              }
              uVar26 = sVar29;
              if (sVar14 < sVar29) {
                uVar26 = sVar14;
              }
              iVar11 = strncmp(pcVar18,pcVar15,uVar26);
              iVar9 = (int)sVar14 - (int)sVar29;
              if (iVar11 != 0) {
                iVar9 = iVar11;
              }
              if (0 < iVar9) break;
              bVar31 = pcVar21->next != (curl_slist *)0x0;
              pcVar25 = pcVar21;
              pcVar7 = pcVar21->next;
              if (!bVar31) {
                pcVar25 = list;
                pcVar7 = pcVar16;
              }
              bVar6 = !bVar30;
              bVar30 = (bool)(bVar30 & bVar31);
              if (!bVar31 && bVar6) goto LAB_00138382;
            }
            pcVar25->data = pcVar15;
            pcVar21->data = pcVar18;
            pcVar7 = pcVar21->next;
            pcVar25 = pcVar21;
            bVar30 = true;
          } while (pcVar21->next != (curl_slist *)0x0);
        } while( true );
      }
LAB_00138382:
      do {
        CVar10 = Curl_dyn_add(&canonical_headers,pcVar27->data);
        if ((CVar10 != CURLE_OK) ||
           (CVar10 = Curl_dyn_add(&canonical_headers,"\n"), CVar10 != CURLE_OK)) goto LAB_001384a0;
        pcVar18 = strchr(pcVar27->data,0x3a);
        if (pcVar18 != (char *)0x0) {
          *pcVar18 = '\0';
        }
        if (((pcVar27 != list) && (CVar10 = Curl_dyn_add(&signed_headers,";"), CVar10 != CURLE_OK))
           || (CVar10 = Curl_dyn_add(&signed_headers,pcVar27->data), CVar10 != CURLE_OK))
        goto LAB_001384a0;
        ppcVar1 = &pcVar27->next;
        pcVar27 = *ppcVar1;
        pcVar16 = list;
      } while (*ppcVar1 != (curl_slist *)0x0);
    }
    else {
      pbVar19 = (byte *)strchr(pcVar18,0x3a);
      if (pbVar19 == (byte *)0x0) goto LAB_00138204;
      pbVar20 = pbVar19 + 0x11;
      while( true ) {
        pbVar24 = pbVar19 + 1;
        bVar3 = *pbVar24;
        if ((bVar3 != 9) && (pbVar5 = pbVar24, bVar3 != 0x20)) break;
        pbVar20 = pbVar20 + 1;
        pbVar19 = pbVar24;
      }
      while ((bVar3 != 0 && (((byte)(bVar3 - 0x30) < 10 || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a))))
            ) {
        bVar3 = pbVar5[1];
        pbVar5 = pbVar5 + 1;
      }
      if (pbVar5 == pbVar20) {
        timestamp._0_8_ = *(undefined8 *)pbVar24;
        timestamp._8_8_ = *(undefined8 *)(pbVar19 + 9);
        timestamp[0x10] = '\0';
      }
      else {
        timestamp._0_8_ = timestamp._0_8_ & 0xffffffffffffff00;
      }
      local_488 = (char *)0x0;
      pcVar16 = (curl_slist *)0x0;
      if (list != (curl_slist *)0x0) goto LAB_00138269;
    }
    curl_slist_free_all(pcVar16);
    if (content_sha256_hdr[0] != '\0') {
      sVar14 = strlen(content_sha256_hdr);
      (content_sha256_hdr + sVar14)[0] = '\r';
      (content_sha256_hdr + sVar14)[1] = '\n';
      content_sha256_hdr[sVar14 + 2] = '\0';
    }
    key[0] = timestamp[0];
    key[1] = timestamp[1];
    key[2] = timestamp[2];
    key[3] = timestamp[3];
    key[4] = timestamp[4];
    key[5] = timestamp[5];
    key[6] = timestamp[6];
    key[7] = timestamp[7];
    key[8] = '\0';
    CVar10 = canon_query(data,(data->state).up.query,&canonical_query);
    if (CVar10 != CURLE_OK) {
LAB_0013856f:
      local_4a0 = (uchar *)0x0;
      input = (uchar *)0x0;
      pcVar18 = (char *)0x0;
      data_00 = (uchar *)0x0;
      key_00 = (uchar *)0x0;
      goto LAB_001384c1;
    }
    pcVar18 = (data->state).up.path;
    sVar14 = strlen(pcVar18);
    CVar10 = canon_string(pcVar18,sVar14,&canonical_path,(_Bool *)0x0);
    pcVar18 = method;
    if (CVar10 != CURLE_OK) goto LAB_0013856f;
    pcVar15 = Curl_dyn_ptr(&canonical_path);
    pcVar22 = Curl_dyn_ptr(&canonical_query);
    if (pcVar22 != (char *)0x0) {
      local_480 = Curl_dyn_ptr(&canonical_query);
    }
    pcVar22 = Curl_dyn_ptr(&canonical_headers);
    pcVar23 = Curl_dyn_ptr(&signed_headers);
    input = (uchar *)curl_maprintf("%s\n%s\n%s\n%s\n%s\n%.*s",pcVar18,pcVar15,local_480,pcVar22,
                                   pcVar23,sVar13,pcVar12);
    if (input == (uchar *)0x0) {
      input = (uchar *)0x0;
LAB_001386e9:
      local_4a0 = (uchar *)0x0;
      pcVar18 = (char *)0x0;
      data_00 = (uchar *)0x0;
      key_00 = (uchar *)0x0;
      CVar10 = CURLE_OUT_OF_MEMORY;
      goto LAB_001384c1;
    }
    sVar13 = strlen(provider0);
    Curl_strntolower(provider0,provider0,sVar13);
    local_4a0 = (uchar *)curl_maprintf("%s4_request",provider0);
    if (local_4a0 == (uchar *)0x0) goto LAB_001386e9;
    pcVar18 = curl_maprintf("%s/%s/%s/%s",key,region,service,local_4a0);
    if (pcVar18 == (char *)0x0) {
      pcVar18 = (char *)0x0;
      key_00 = (uchar *)0x0;
      CVar10 = CURLE_OUT_OF_MEMORY;
      data_00 = (uchar *)0x0;
      goto LAB_001384c1;
    }
    sVar13 = strlen((char *)input);
    CVar10 = Curl_sha256it(sha_hash,input,sVar13);
    if (CVar10 != CURLE_OK) {
      data_00 = (uchar *)0x0;
LAB_001386ab:
      key_00 = (uchar *)0x0;
      CVar10 = CURLE_OUT_OF_MEMORY;
      goto LAB_001384c1;
    }
    Curl_hexencode(sha_hash,0x20,(uchar *)sha_hex,0x41);
    sVar13 = strlen(provider0);
    Curl_strntoupper(provider0,provider0,sVar13);
    data_00 = (uchar *)curl_maprintf("%s4-HMAC-SHA256\n%s\n%s\n%s",provider0,timestamp,pcVar18,
                                     sha_hex);
    if (data_00 != (uchar *)0x0) {
      pcVar12 = (data->state).aptr.passwd;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "";
      }
      key_00 = (uchar *)curl_maprintf("%s4%s",provider0,pcVar12);
      if (key_00 != (uchar *)0x0) {
        sVar13 = strlen((char *)key_00);
        sVar14 = strlen(key);
        CVar10 = Curl_hmacit(Curl_HMAC_SHA256,key_00,sVar13,(uchar *)key,sVar14,sign0);
        if (CVar10 == CURLE_OK) {
          sVar13 = strlen(region);
          CVar10 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,(uchar *)region,sVar13,sign1);
          if (CVar10 == CURLE_OK) {
            sVar13 = strlen(service);
            CVar10 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,(uchar *)service,sVar13,sign0);
            if (CVar10 == CURLE_OK) {
              sVar13 = strlen((char *)local_4a0);
              CVar10 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,local_4a0,sVar13,sign1);
              if (CVar10 == CURLE_OK) {
                sVar13 = strlen((char *)data_00);
                CVar10 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,data_00,sVar13,sign0);
                if (CVar10 == CURLE_OK) {
                  Curl_hexencode(sign0,0x20,(uchar *)sha_hex,0x41);
                  pcVar15 = Curl_dyn_ptr(&signed_headers);
                  pcVar12 = "";
                  if (local_488 != (char *)0x0) {
                    pcVar12 = local_488;
                  }
                  pcVar28 = curl_maprintf("Authorization: %s4-HMAC-SHA256 Credential=%s/%s, SignedHeaders=%s, Signature=%s\r\n%s%s"
                                          ,provider0,pcVar28,pcVar18,pcVar15,sha_hex,pcVar12,
                                          content_sha256_hdr);
                  if (pcVar28 != (char *)0x0) {
                    (*Curl_cfree)((data->state).aptr.userpwd);
                    (data->state).aptr.userpwd = pcVar28;
                    puVar2 = &(data->state).authhost.field_0x18;
                    *puVar2 = *puVar2 | 1;
                  }
                  CVar10 = CURLE_OK;
                }
              }
            }
          }
        }
        goto LAB_001384c1;
      }
      goto LAB_001386ab;
    }
    CVar10 = CURLE_OUT_OF_MEMORY;
  }
  data_00 = (uchar *)0x0;
  key_00 = (uchar *)0x0;
LAB_001384c1:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_path);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  (*Curl_cfree)(input);
  (*Curl_cfree)(local_4a0);
  (*Curl_cfree)(pcVar18);
  (*Curl_cfree)(data_00);
  (*Curl_cfree)(key_00);
  (*Curl_cfree)(local_488);
  return CVar10;
}

Assistant:

CURLcode Curl_output_aws_sigv4(struct Curl_easy *data, bool proxy)
{
  CURLcode result = CURLE_OUT_OF_MEMORY;
  struct connectdata *conn = data->conn;
  size_t len;
  const char *arg;
  char provider0[MAX_SIGV4_LEN + 1]="";
  char provider1[MAX_SIGV4_LEN + 1]="";
  char region[MAX_SIGV4_LEN + 1]="";
  char service[MAX_SIGV4_LEN + 1]="";
  bool sign_as_s3 = FALSE;
  const char *hostname = conn->host.name;
  time_t clock;
  struct tm tm;
  char timestamp[TIMESTAMP_SIZE];
  char date[9];
  struct dynbuf canonical_headers;
  struct dynbuf signed_headers;
  struct dynbuf canonical_query;
  struct dynbuf canonical_path;
  char *date_header = NULL;
  Curl_HttpReq httpreq;
  const char *method = NULL;
  char *payload_hash = NULL;
  size_t payload_hash_len = 0;
  unsigned char sha_hash[CURL_SHA256_DIGEST_LENGTH];
  char sha_hex[SHA256_HEX_LENGTH];
  char content_sha256_hdr[CONTENT_SHA256_HDR_LEN + 2] = ""; /* add \r\n */
  char *canonical_request = NULL;
  char *request_type = NULL;
  char *credential_scope = NULL;
  char *str_to_sign = NULL;
  const char *user = data->state.aptr.user ? data->state.aptr.user : "";
  char *secret = NULL;
  unsigned char sign0[CURL_SHA256_DIGEST_LENGTH] = {0};
  unsigned char sign1[CURL_SHA256_DIGEST_LENGTH] = {0};
  char *auth_headers = NULL;

  DEBUGASSERT(!proxy);
  (void)proxy;

  if(Curl_checkheaders(data, STRCONST("Authorization"))) {
    /* Authorization already present, Bailing out */
    return CURLE_OK;
  }

  /* we init those buffers here, so goto fail will free initialized dynbuf */
  Curl_dyn_init(&canonical_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&canonical_query, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&signed_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&canonical_path, CURL_MAX_HTTP_HEADER);

  /*
   * Parameters parsing
   * Google and Outscale use the same OSC or GOOG,
   * but Amazon uses AWS and AMZ for header arguments.
   * AWS is the default because most of non-amazon providers
   * are still using aws:amz as a prefix.
   */
  arg = data->set.str[STRING_AWS_SIGV4] ?
    data->set.str[STRING_AWS_SIGV4] : "aws:amz";

  /* provider1[:provider2[:region[:service]]]

     No string can be longer than N bytes of non-whitespace
  */
  (void)sscanf(arg, "%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "s",
               provider0, provider1, region, service);
  if(!provider0[0]) {
    failf(data, "first aws-sigv4 provider cannot be empty");
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto fail;
  }
  else if(!provider1[0])
    strcpy(provider1, provider0);

  if(!service[0]) {
    char *hostdot = strchr(hostname, '.');
    if(!hostdot) {
      failf(data, "aws-sigv4: service missing in parameters and hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    len = hostdot - hostname;
    if(len > MAX_SIGV4_LEN) {
      failf(data, "aws-sigv4: service too long in hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    memcpy(service, hostname, len);
    service[len] = '\0';

    infof(data, "aws_sigv4: picked service %s from host", service);

    if(!region[0]) {
      const char *reg = hostdot + 1;
      const char *hostreg = strchr(reg, '.');
      if(!hostreg) {
        failf(data, "aws-sigv4: region missing in parameters and hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      len = hostreg - reg;
      if(len > MAX_SIGV4_LEN) {
        failf(data, "aws-sigv4: region too long in hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      memcpy(region, reg, len);
      region[len] = '\0';
      infof(data, "aws_sigv4: picked region %s from host", region);
    }
  }

  Curl_http_method(data, conn, &method, &httpreq);

  /* AWS S3 requires a x-amz-content-sha256 header, and supports special
   * values like UNSIGNED-PAYLOAD */
  sign_as_s3 = (strcasecompare(provider0, "aws") &&
                strcasecompare(service, "s3"));

  payload_hash = parse_content_sha_hdr(data, provider1, &payload_hash_len);

  if(!payload_hash) {
    if(sign_as_s3)
      result = calc_s3_payload_hash(data, httpreq, provider1, sha_hash,
                                    sha_hex, content_sha256_hdr);
    else
      result = calc_payload_hash(data, sha_hash, sha_hex);
    if(result)
      goto fail;

    payload_hash = sha_hex;
    /* may be shorter than SHA256_HEX_LENGTH, like S3_UNSIGNED_PAYLOAD */
    payload_hash_len = strlen(sha_hex);
  }

#ifdef DEBUGBUILD
  {
    char *force_timestamp = getenv("CURL_FORCETIME");
    if(force_timestamp)
      clock = 0;
    else
      clock = time(NULL);
  }
#else
  clock = time(NULL);
#endif
  result = Curl_gmtime(clock, &tm);
  if(result) {
    goto fail;
  }
  if(!strftime(timestamp, sizeof(timestamp), "%Y%m%dT%H%M%SZ", &tm)) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = make_headers(data, hostname, timestamp, provider1,
                        &date_header, content_sha256_hdr,
                        &canonical_headers, &signed_headers);
  if(result)
    goto fail;

  if(*content_sha256_hdr) {
    /* make_headers() needed this without the \r\n for canonicalization */
    size_t hdrlen = strlen(content_sha256_hdr);
    DEBUGASSERT(hdrlen + 3 < sizeof(content_sha256_hdr));
    memcpy(content_sha256_hdr + hdrlen, "\r\n", 3);
  }

  memcpy(date, timestamp, sizeof(date));
  date[sizeof(date) - 1] = 0;

  result = canon_query(data, data->state.up.query, &canonical_query);
  if(result)
    goto fail;

  result = canon_string(data->state.up.path, strlen(data->state.up.path),
                        &canonical_path, NULL);
  if(result)
    goto fail;
  result = CURLE_OUT_OF_MEMORY;

  canonical_request =
    aprintf("%s\n" /* HTTPRequestMethod */
            "%s\n" /* CanonicalURI */
            "%s\n" /* CanonicalQueryString */
            "%s\n" /* CanonicalHeaders */
            "%s\n" /* SignedHeaders */
            "%.*s",  /* HashedRequestPayload in hex */
            method,
            Curl_dyn_ptr(&canonical_path),
            Curl_dyn_ptr(&canonical_query) ?
            Curl_dyn_ptr(&canonical_query) : "",
            Curl_dyn_ptr(&canonical_headers),
            Curl_dyn_ptr(&signed_headers),
            (int)payload_hash_len, payload_hash);
  if(!canonical_request)
    goto fail;

  DEBUGF(infof(data, "Canonical request: %s", canonical_request));

  /* provider 0 lowercase */
  Curl_strntolower(provider0, provider0, strlen(provider0));
  request_type = aprintf("%s4_request", provider0);
  if(!request_type)
    goto fail;

  credential_scope = aprintf("%s/%s/%s/%s",
                             date, region, service, request_type);
  if(!credential_scope)
    goto fail;

  if(Curl_sha256it(sha_hash, (unsigned char *) canonical_request,
                   strlen(canonical_request)))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash);

  /* provider 0 uppercase */
  Curl_strntoupper(provider0, provider0, strlen(provider0));

  /*
   * Google allows using RSA key instead of HMAC, so this code might change
   * in the future. For now we only support HMAC.
   */
  str_to_sign = aprintf("%s4-HMAC-SHA256\n" /* Algorithm */
                        "%s\n" /* RequestDateTime */
                        "%s\n" /* CredentialScope */
                        "%s",  /* HashedCanonicalRequest in hex */
                        provider0,
                        timestamp,
                        credential_scope,
                        sha_hex);
  if(!str_to_sign) {
    goto fail;
  }

  /* provider 0 uppercase */
  secret = aprintf("%s4%s", provider0,
                   data->state.aptr.passwd ?
                   data->state.aptr.passwd : "");
  if(!secret)
    goto fail;

  HMAC_SHA256(secret, strlen(secret), date, strlen(date), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), region, strlen(region), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), service, strlen(service), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), request_type, strlen(request_type), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), str_to_sign, strlen(str_to_sign), sign0);

  sha256_to_hex(sha_hex, sign0);

  /* provider 0 uppercase */
  auth_headers = aprintf("Authorization: %s4-HMAC-SHA256 "
                         "Credential=%s/%s, "
                         "SignedHeaders=%s, "
                         "Signature=%s\r\n"
                         /*
                          * date_header is added here, only if it was not
                          * user-specified (using CURLOPT_HTTPHEADER).
                          * date_header includes \r\n
                          */
                         "%s"
                         "%s", /* optional sha256 header includes \r\n */
                         provider0,
                         user,
                         credential_scope,
                         Curl_dyn_ptr(&signed_headers),
                         sha_hex,
                         date_header ? date_header : "",
                         content_sha256_hdr);
  if(!auth_headers) {
    goto fail;
  }

  Curl_safefree(data->state.aptr.userpwd);
  data->state.aptr.userpwd = auth_headers;
  data->state.authhost.done = TRUE;
  result = CURLE_OK;

fail:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_path);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  free(canonical_request);
  free(request_type);
  free(credential_scope);
  free(str_to_sign);
  free(secret);
  free(date_header);
  return result;
}